

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_connect(connectdata *conn,int sockindex)

{
  _Bool _Var1;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  
  if ((((conn->bits).proxy_ssl_connected[sockindex] & 1U) == 0) ||
     (conn_local._4_4_ = ssl_connect_init_proxy(conn,sockindex), conn_local._4_4_ == CURLE_OK)) {
    _Var1 = ssl_prefs_check(conn->data);
    if (_Var1) {
      conn->ssl[sockindex].field_0x10 = conn->ssl[sockindex].field_0x10 & 0xfe | 1;
      conn->ssl[sockindex].state = ssl_connection_negotiating;
      conn_local._4_4_ = (*Curl_ssl->connect_blocking)(conn,sockindex);
      if (conn_local._4_4_ == CURLE_OK) {
        Curl_pgrsTime(conn->data,TIMER_APPCONNECT);
      }
    }
    else {
      conn_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode
Curl_ssl_connect(struct connectdata *conn, int sockindex)
{
  CURLcode result;

  if(conn->bits.proxy_ssl_connected[sockindex]) {
    result = ssl_connect_init_proxy(conn, sockindex);
    if(result)
      return result;
  }

  if(!ssl_prefs_check(conn->data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl-enabled from here on. */
  conn->ssl[sockindex].use = TRUE;
  conn->ssl[sockindex].state = ssl_connection_negotiating;

  result = Curl_ssl->connect_blocking(conn, sockindex);

  if(!result)
    Curl_pgrsTime(conn->data, TIMER_APPCONNECT); /* SSL is connected */

  return result;
}